

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.cc
# Opt level: O2

bool __thiscall DyndepParser::ParseLet(DyndepParser *this,string *key,EvalString *value,string *err)

{
  Lexer *this_00;
  bool bVar1;
  allocator<char> local_41;
  string local_40;
  
  this_00 = &(this->super_Parser).lexer_;
  bVar1 = Lexer::ReadIdent(this_00,key);
  if (bVar1) {
    bVar1 = Parser::ExpectToken(&this->super_Parser,EQUALS,err);
    if (bVar1) {
      bVar1 = Lexer::ReadVarValue(this_00,value,err);
      return bVar1;
    }
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"expected variable name",&local_41);
    bVar1 = Lexer::Error(this_00,&local_40,err);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return bVar1;
}

Assistant:

bool DyndepParser::ParseLet(string* key, EvalString* value, string* err) {
  if (!lexer_.ReadIdent(key))
    return lexer_.Error("expected variable name", err);
  if (!ExpectToken(Lexer::EQUALS, err))
    return false;
  if (!lexer_.ReadVarValue(value, err))
    return false;
  return true;
}